

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

bool __thiscall
wasm::analysis::Vector<wasm::RandomFullLattice>::join
          (Vector<wasm::RandomFullLattice> *this,Element *joinee,Element *joiner)

{
  pointer pRVar1;
  pointer pRVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  
  pRVar1 = (joinee->
           super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (joinee->
           super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pRVar2 - (long)pRVar1;
  if (lVar5 >> 4 != this->size) {
    __assert_fail("joinee.size() == size",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/lattices/vector.h"
                  ,0x54,
                  "bool wasm::analysis::Vector<wasm::RandomFullLattice>::join(Element &, const Element &) const [L = wasm::RandomFullLattice]"
                 );
  }
  if ((long)(joiner->
            super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(joiner->
            super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
            )._M_impl.super__Vector_impl_data._M_start != lVar5) {
    __assert_fail("joiner.size() == size",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/lattices/vector.h"
                  ,0x55,
                  "bool wasm::analysis::Vector<wasm::RandomFullLattice>::join(Element &, const Element &) const [L = wasm::RandomFullLattice]"
                 );
  }
  if (pRVar2 == pRVar1) {
    bVar6 = false;
  }
  else {
    lVar5 = 0;
    uVar4 = 0;
    bVar6 = false;
    do {
      bVar3 = RandomFullLattice::join
                        (&this->lattice,
                         (Element *)
                         ((long)&(((joinee->
                                   super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
                                 super___uniq_ptr_impl<void,_void_(*)(void_*)> + lVar5),
                         (Element *)
                         ((long)&(((joiner->
                                   super__Vector_base<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
                                 super___uniq_ptr_impl<void,_void_(*)(void_*)> + lVar5));
      bVar6 = (bool)(bVar6 | bVar3);
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar4 < this->size);
  }
  return bVar6;
}

Assistant:

bool join(Element& joinee, const Element& joiner) const noexcept {
    assert(joinee.size() == size);
    assert(joiner.size() == size);
    bool result = false;
    for (size_t i = 0; i < size; ++i) {
      result |= joinAtIndex(joinee, i, joiner[i]);
    }
    return result;
  }